

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

void xmlRelaxNGSetValidStructuredErrors
               (xmlRelaxNGValidCtxtPtr ctxt,xmlStructuredErrorFunc serror,void *ctx)

{
  if (ctxt != (xmlRelaxNGValidCtxtPtr)0x0) {
    ctxt->serror = serror;
    ctxt->error = (xmlRelaxNGValidityErrorFunc)0x0;
    ctxt->warning = (xmlRelaxNGValidityWarningFunc)0x0;
    ctxt->userData = ctx;
  }
  return;
}

Assistant:

void
xmlRelaxNGSetValidStructuredErrors(xmlRelaxNGValidCtxtPtr ctxt,
                                   xmlStructuredErrorFunc serror, void *ctx)
{
    if (ctxt == NULL)
        return;
    ctxt->serror = serror;
    ctxt->error = NULL;
    ctxt->warning = NULL;
    ctxt->userData = ctx;
}